

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O0

window_flags hmi::anon_unknown_0::compute_window_flags(Uint32 flags)

{
  window_flags in_EDI;
  window_flags res;
  
  if ((in_EDI & 0x20) != none) {
    operator|=((window_flags *)CONCAT44(flags,res),in_EDI);
  }
  if ((in_EDI & decorated) != none) {
    operator|=((window_flags *)CONCAT44(flags,res),in_EDI);
  }
  if ((in_EDI & 0x10) == none) {
    operator|=((window_flags *)CONCAT44(flags,res),in_EDI);
  }
  return none;
}

Assistant:

window_flags compute_window_flags(Uint32 flags) {
      window_flags res = window_flags::none;

      if ((flags & SDL_WINDOW_RESIZABLE) != 0) {
        res |= window_flags::resizable;
      }

      if ((flags & SDL_WINDOW_SHOWN) != 0) {
        res |= window_flags::visible;
      }

      if ((flags & SDL_WINDOW_BORDERLESS) == 0) {
        res |= window_flags::decorated;
      }

      return res;
    }